

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::ParseChunk(Discreet3DSImporter *this,char *name,uint num)

{
  aiVector3D *paVar1;
  StreamReader<false,_false> *this_00;
  Scene *pSVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  aiLight *paVar7;
  aiCamera *paVar8;
  Logger *this_01;
  float fVar9;
  aiVector3t<float> aVar10;
  undefined8 local_238;
  float local_230;
  aiVector3t<float> local_224;
  aiMatrix3x3t<float> local_218;
  undefined8 local_1f4;
  float local_1ec;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  undefined1 local_1c8 [8];
  aiQuaternion quat;
  ai_real angle;
  float local_1ac;
  allocator local_1a1;
  ai_real len;
  aiCamera *local_180;
  aiCamera *camera;
  allocator local_169;
  string local_168;
  aiLight *local_148;
  aiLight *light;
  allocator local_129;
  string local_128;
  Mesh local_108;
  uint local_2c;
  int local_28;
  uint oldReadLimit;
  int chunkSize;
  undefined1 auStack_1c [2];
  Chunk chunk;
  uint num_local;
  char *name_local;
  Discreet3DSImporter *this_local;
  
  _auStack_1c = num;
  unique0x10000889 = name;
  do {
    do {
      uVar4 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar4 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      local_28 = chunkSize + -6;
    } while (local_28 < 1);
    this_00 = this->stream;
    iVar5 = StreamReader<false,_false>::GetCurrentPos(this_00);
    local_2c = StreamReader<false,_false>::SetReadLimit(this_00,iVar5 + local_28);
    pcVar3 = stack0xffffffffffffffe8;
    if (oldReadLimit._2_2_ == 0x4100) {
      pSVar2 = this->mScene;
      uVar6 = (ulong)_auStack_1c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,pcVar3,uVar6,&local_129);
      D3DS::Mesh::Mesh(&local_108,&local_128);
      std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::push_back
                (&pSVar2->mMeshes,&local_108);
      D3DS::Mesh::~Mesh(&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      ParseMeshChunk(this);
    }
    else if (oldReadLimit._2_2_ == 0x4600) {
      paVar7 = (aiLight *)operator_new(0x46c);
      aiLight::aiLight(paVar7);
      local_148 = paVar7;
      std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back
                (&this->mScene->mLights,&local_148);
      pcVar3 = stack0xffffffffffffffe8;
      paVar7 = local_148;
      uVar6 = (ulong)_auStack_1c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,pcVar3,uVar6,&local_169);
      aiString::Set(&paVar7->mName,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_148->mPosition).x = fVar9;
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_148->mPosition).y = fVar9;
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_148->mPosition).z = fVar9;
      aiColor3D::aiColor3D((aiColor3D *)&camera,1.0,1.0,1.0);
      aiColor3D::operator=(&local_148->mColorDiffuse,(aiColor3D *)&camera);
      if ((this->bIsPrj & 1U) == 0) {
        ParseLightChunk(this);
      }
      aiColor3D::operator=(&local_148->mColorSpecular,&local_148->mColorDiffuse);
      aiColor3D::operator=(&local_148->mColorAmbient,&this->mClrAmbient);
      if (local_148->mType == aiLightSource_UNDEFINED) {
        local_148->mType = aiLightSource_POINT;
      }
    }
    else if (oldReadLimit._2_2_ == 0x4700) {
      paVar8 = (aiCamera *)operator_new(0x438);
      aiCamera::aiCamera(paVar8);
      local_180 = paVar8;
      std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back
                (&this->mScene->mCameras,&local_180);
      pcVar3 = stack0xffffffffffffffe8;
      paVar8 = local_180;
      uVar6 = (ulong)_auStack_1c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&len,pcVar3,uVar6,&local_1a1);
      aiString::Set(&paVar8->mName,(string *)&len);
      std::__cxx11::string::~string((string *)&len);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_180->mPosition).x = fVar9;
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_180->mPosition).y = fVar9;
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_180->mPosition).z = fVar9;
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_180->mLookAt).x = fVar9 - (local_180->mPosition).x;
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_180->mLookAt).y = fVar9 - (local_180->mPosition).y;
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      (local_180->mLookAt).z = fVar9 - (local_180->mPosition).z;
      fVar9 = aiVector3t<float>::Length(&local_180->mLookAt);
      if (1e-05 <= fVar9) {
        aiVector3t<float>::operator/=(&local_180->mLookAt,fVar9);
      }
      else {
        this_01 = DefaultLogger::get();
        Logger::error(this_01,"3DS: Unable to read proper camera look-at vector");
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&quat.z,0.0,1.0,0.0);
        (local_180->mLookAt).x = quat.z;
        (local_180->mLookAt).y = angle;
        (local_180->mLookAt).z = local_1ac;
      }
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      quat.y = fVar9 * 0.017453292;
      local_1e0 = (local_180->mLookAt).z;
      paVar1 = &local_180->mLookAt;
      local_1e8._0_4_ = paVar1->x;
      local_1e8._4_4_ = paVar1->y;
      aVar10.x = paVar1->x;
      aVar10.y = paVar1->y;
      aVar10.z = paVar1->z;
      local_1d8 = local_1e8;
      local_1d0 = local_1e0;
      aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)local_1c8,aVar10,quat.y);
      aiQuaterniont<float>::GetMatrix(&local_218,(aiQuaterniont<float> *)local_1c8);
      aiVector3t<float>::aiVector3t(&local_224,0.0,1.0,0.0);
      aVar10 = ::operator*(&local_218,&local_224);
      local_238 = aVar10._0_8_;
      local_1f4 = local_238;
      local_230 = aVar10.z;
      local_1ec = local_230;
      (local_180->mUp).x = (float)(undefined4)local_238;
      (local_180->mUp).y = (float)local_238._4_4_;
      (local_180->mUp).z = local_230;
      fVar9 = StreamReader<false,_false>::GetF4(this->stream);
      local_180->mHorizontalFOV = fVar9 * 0.017453292;
      if (local_180->mHorizontalFOV <= 0.001 && local_180->mHorizontalFOV != 0.001) {
        local_180->mHorizontalFOV = 0.7853982;
      }
      if ((this->bIsPrj & 1U) == 0) {
        ParseCameraChunk(this);
      }
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,local_2c);
    uVar4 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  } while (uVar4 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseChunk(const char* name, unsigned int num)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // IMPLEMENTATION NOTE;
    // Cameras or lights define their transformation in their parent node and in the
    // corresponding light or camera chunks. However, we read and process the latter
    // to to be able to return valid cameras/lights even if no scenegraph is given.

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_TRIMESH:
        {
        // this starts a new triangle mesh
        mScene->mMeshes.push_back(D3DS::Mesh(std::string(name, num)));

        // Read mesh chunks
        ParseMeshChunk();
        }
        break;

    case Discreet3DS::CHUNK_LIGHT:
        {
        // This starts a new light
        aiLight* light = new aiLight();
        mScene->mLights.push_back(light);

        light->mName.Set(std::string(name, num));

        // First read the position of the light
        light->mPosition.x = stream->GetF4();
        light->mPosition.y = stream->GetF4();
        light->mPosition.z = stream->GetF4();

        light->mColorDiffuse = aiColor3D(1.f,1.f,1.f);

        // Now check for further subchunks
        if (!bIsPrj) /* fixme */
            ParseLightChunk();

        // The specular light color is identical the the diffuse light color. The ambient light color
        // is equal to the ambient base color of the whole scene.
        light->mColorSpecular = light->mColorDiffuse;
        light->mColorAmbient  = mClrAmbient;

        if (light->mType == aiLightSource_UNDEFINED)
        {
            // It must be a point light
            light->mType = aiLightSource_POINT;
        }}
        break;

    case Discreet3DS::CHUNK_CAMERA:
        {
        // This starts a new camera
        aiCamera* camera = new aiCamera();
        mScene->mCameras.push_back(camera);
        camera->mName.Set(std::string(name, num));

        // First read the position of the camera
        camera->mPosition.x = stream->GetF4();
        camera->mPosition.y = stream->GetF4();
        camera->mPosition.z = stream->GetF4();

        // Then the camera target
        camera->mLookAt.x = stream->GetF4() - camera->mPosition.x;
        camera->mLookAt.y = stream->GetF4() - camera->mPosition.y;
        camera->mLookAt.z = stream->GetF4() - camera->mPosition.z;
        ai_real len = camera->mLookAt.Length();
        if (len < 1e-5) {

            // There are some files with lookat == position. Don't know why or whether it's ok or not.
            ASSIMP_LOG_ERROR("3DS: Unable to read proper camera look-at vector");
            camera->mLookAt = aiVector3D(0.0,1.0,0.0);

        }
        else camera->mLookAt /= len;

        // And finally - the camera rotation angle, in counter clockwise direction
        const ai_real angle =  AI_DEG_TO_RAD( stream->GetF4() );
        aiQuaternion quat(camera->mLookAt,angle);
        camera->mUp = quat.GetMatrix() * aiVector3D(0.0,1.0,0.0);

        // Read the lense angle
        camera->mHorizontalFOV = AI_DEG_TO_RAD ( stream->GetF4() );
        if (camera->mHorizontalFOV < 0.001f)  {
            camera->mHorizontalFOV = AI_DEG_TO_RAD(45.f);
        }

        // Now check for further subchunks
        if (!bIsPrj) /* fixme */ {
            ParseCameraChunk();
        }}
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}